

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputfile.cpp
# Opt level: O0

int __thiscall OutputFile::initWriter(OutputFile *this)

{
  _Ios_Openmode _Var1;
  _Ios_Openmode __a;
  int iVar2;
  ulong uVar3;
  long lVar4;
  fpos<__mbstate_t> local_88;
  undefined4 local_78;
  undefined4 local_74;
  int sysBuf [21];
  OutputFile *this_local;
  
  uVar3 = std::ofstream::is_open();
  if (((uVar3 & 1) == 0) || (this->network == (Network *)0x0)) {
    this_local._4_4_ = 0;
  }
  else {
    std::ofstream::close();
    std::ifstream::close();
    _Var1 = std::__cxx11::string::c_str();
    __a = std::operator|(_S_out,_S_bin);
    std::operator|(__a,_S_trunc);
    std::ofstream::open((char *)&this->fwriter,_Var1);
    uVar3 = std::ofstream::is_open();
    if ((uVar3 & 1) == 0) {
      this_local._4_4_ = 3;
    }
    else {
      iVar2 = Network::count(this->network,NODE);
      this->nodeCount = iVar2;
      iVar2 = Network::count(this->network,LINK);
      this->linkCount = iVar2;
      iVar2 = findPumpCount(this->network);
      this->pumpCount = iVar2;
      this->timePeriodCount = 0;
      lVar4 = Network::option(this->network,REPORT_START);
      this->reportStart = (int)lVar4;
      lVar4 = Network::option(this->network,REPORT_STEP);
      this->reportStep = (int)lVar4;
      this->energyResultsOffset = 0x54;
      this->networkResultsOffset = this->energyResultsOffset + this->pumpCount * 0x1c + 4;
      local_78 = 0x49b1beb5;
      local_74 = 30000;
      sysBuf[0] = 0;
      sysBuf[1] = 0;
      sysBuf[2] = this->energyResultsOffset;
      sysBuf[3] = this->networkResultsOffset;
      sysBuf[4] = this->nodeCount;
      sysBuf[5] = this->linkCount;
      sysBuf[6] = this->pumpCount;
      sysBuf[7] = Network::option(this->network,QUAL_TYPE);
      sysBuf[8] = Network::option(this->network,TRACE_NODE);
      sysBuf[9] = Network::option(this->network,UNIT_SYSTEM);
      sysBuf[10] = Network::option(this->network,FLOW_UNITS);
      sysBuf[0xb] = Network::option(this->network,PRESSURE_UNITS);
      sysBuf[0xc] = Network::option(this->network,QUAL_UNITS);
      lVar4 = Network::option(this->network,REPORT_STATISTIC);
      sysBuf[0xd] = (int)lVar4;
      sysBuf[0xe] = this->reportStart;
      sysBuf[0xf] = this->reportStep;
      sysBuf[0x10] = 6;
      sysBuf[0x11] = 7;
      sysBuf[0x12] = 6;
      std::ostream::write((char *)&this->fwriter,(long)&local_78);
      uVar3 = std::ios::fail();
      if ((uVar3 & 1) == 0) {
        std::fpos<__mbstate_t>::fpos(&local_88,(long)this->networkResultsOffset);
        std::ostream::seekp(&this->fwriter,local_88._M_off,local_88._M_state);
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = 7;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int OutputFile::initWriter()
{
    // ... return if output file not previously opened
    if ( !fwriter.is_open() || !network ) return 0;

    // ... re-open the output file
    fwriter.close();
    freader.close();
    fwriter.open(fname.c_str(), ios::out | ios::binary | ios::trunc);
    if ( !fwriter.is_open() ) return FileError::CANNOT_OPEN_OUTPUT_FILE;

    // ... retrieve element counts
    nodeCount = network->count(Element::NODE);
    linkCount = network->count(Element::LINK);
    pumpCount = findPumpCount(network);

    // ... retrieve reporting time steps
    timePeriodCount = 0;
    reportStart = network->option(Options::REPORT_START);
    reportStep = network->option(Options::REPORT_STEP);

    // ... compute byte offsets for where energy results and network results begin
    energyResultsOffset = NumSysVars * IntSize;
    networkResultsOffset = energyResultsOffset + pumpCount *
                           (IntSize + NumPumpVars * FloatSize) + FloatSize;

    // ... write system info to the output file
    int sysBuf[NumSysVars];
    sysBuf[0] = MAGICNUMBER;
    sysBuf[1] = VERSION;
    sysBuf[2] = 0;                     // reserved for error code
    sysBuf[3] = 0;                     // reserved for warning flag
    sysBuf[4] = energyResultsOffset;
    sysBuf[5] = networkResultsOffset;
    sysBuf[6] = nodeCount;
    sysBuf[7] = linkCount;
    sysBuf[8] = pumpCount;
    sysBuf[9] = network->option(Options::QUAL_TYPE);
    sysBuf[10] = network->option(Options::TRACE_NODE);
    sysBuf[11] = network->option(Options::UNIT_SYSTEM);
    sysBuf[12] = network->option(Options::FLOW_UNITS);
    sysBuf[13] = network->option(Options::PRESSURE_UNITS);
    sysBuf[14] = network->option(Options::QUAL_UNITS);
    sysBuf[15] = network->option(Options::REPORT_STATISTIC);
    sysBuf[16] = reportStart;
    sysBuf[17] = reportStep;
    sysBuf[18] = NumNodeVars;
    sysBuf[19] = NumLinkVars;
    sysBuf[20] = NumPumpVars;
    fwriter.write((char *)sysBuf, sizeof(sysBuf));
    if ( fwriter.fail() ) return FileError::CANNOT_WRITE_TO_OUTPUT_FILE;

    // ... position the file to where network results begins
    fwriter.seekp(networkResultsOffset);
    return 0;
}